

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ushort uVar1;
  unsigned_short uVar2;
  int iVar3;
  CallSiteToCallApplyCallSiteMap *pCVar4;
  Type pSVar5;
  FunctionBody *this_00;
  ProfileId *pPVar6;
  unsigned_short *puVar7;
  ulong uVar8;
  int iVar9;
  
  this_00 = FuncInfo::GetParsedFunctionBody(funcInfo);
  pPVar6 = Js::FunctionBody::CreateCallSiteToCallApplyCallSiteArray(this_00);
  if (pPVar6 != (ProfileId *)0x0) {
    pCVar4 = funcInfo->callSiteToCallApplyCallSiteMap;
    for (uVar8 = 0; uVar8 < pCVar4->bucketCount; uVar8 = uVar8 + 1) {
      iVar9 = pCVar4->buckets[uVar8];
      if (pCVar4->buckets[uVar8] != -1) {
        while (iVar9 != -1) {
          pSVar5 = pCVar4->entries;
          iVar3 = pSVar5[iVar9].
                  super_DefaultHashedEntry<unsigned_short,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_short,_unsigned_short>.
                  super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>_>
                  .super_KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>.next;
          uVar1 = pSVar5[iVar9].
                  super_DefaultHashedEntry<unsigned_short,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_short,_unsigned_short>.
                  super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>_>
                  .super_KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>.key;
          uVar2 = pSVar5[iVar9].
                  super_DefaultHashedEntry<unsigned_short,_unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_short,_unsigned_short>.
                  super_ValueEntry<unsigned_short,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>_>
                  .super_KeyValueEntryDataLayout1<unsigned_short,_unsigned_short>.value;
          puVar7 = Js::FunctionProxy::
                   GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                             ((FunctionProxy *)this_00);
          puVar7[uVar1] = uVar2;
          iVar9 = iVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::MapCallSiteToCallApplyCallSiteMap(FuncInfo * funcInfo)
{
    Js::FunctionBody * functionBody = funcInfo->GetParsedFunctionBody();
    
    if (functionBody->CreateCallSiteToCallApplyCallSiteArray())
    {
        funcInfo->callSiteToCallApplyCallSiteMap->Map([functionBody](Js::ProfileId callSiteId, Js::ProfileId callApplyCallSiteId)
        {
            functionBody->GetCallSiteToCallApplyCallSiteArray()[callSiteId] = callApplyCallSiteId;
        });
    }
}